

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_call(HSQUIRRELVM v,SQInteger params,SQBool retval,SQBool raiseerror)

{
  undefined1 uVar1;
  SQVM *this;
  long in_RDX;
  SQInteger in_RDI;
  SQBool unaff_retaddr;
  SQObjectPtr *in_stack_00000008;
  SQInteger in_stack_00000010;
  SQInteger in_stack_00000018;
  SQObjectPtr *in_stack_00000020;
  SQVM *in_stack_00000028;
  SQObjectPtr res;
  SQObjectPtr *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  SQInteger n;
  SQObjectPtr local_38;
  long local_20;
  SQInteger local_10;
  SQRESULT local_8;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  SQObjectPtr::SQObjectPtr(&local_38);
  n = local_10;
  this = (SQVM *)SQVM::GetUp((SQVM *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                             (SQInteger)in_stack_ffffffffffffff98);
  uVar1 = SQVM::Call(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                     in_stack_00000008,unaff_retaddr);
  if ((bool)uVar1) {
    if (*(long *)(local_10 + 0x138) == 0) {
      SQVM::Pop(this,n);
    }
    if (local_20 != 0) {
      SQVM::Push((SQVM *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
    }
    local_8 = 0;
  }
  else {
    SQVM::Pop(this,n);
    local_8 = -1;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)CONCAT17(uVar1,in_stack_ffffffffffffffa0));
  return local_8;
}

Assistant:

SQRESULT sq_call(HSQUIRRELVM v,SQInteger params,SQBool retval,SQBool raiseerror)
{
    SQObjectPtr res;
    if(!v->Call(v->GetUp(-(params+1)),params,v->_top-params,res,raiseerror?true:false)){
        v->Pop(params); //pop args
        return SQ_ERROR;
    }
    if(!v->_suspended)
        v->Pop(params); //pop args
    if(retval)
        v->Push(res); // push result
    return SQ_OK;
}